

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_import(mbedtls_rsa_context *ctx,mbedtls_mpi *N,mbedtls_mpi *P,mbedtls_mpi *Q,
                      mbedtls_mpi *D,mbedtls_mpi *E)

{
  size_t sVar1;
  int local_44;
  int ret;
  mbedtls_mpi *E_local;
  mbedtls_mpi *D_local;
  mbedtls_mpi *Q_local;
  mbedtls_mpi *P_local;
  mbedtls_mpi *N_local;
  mbedtls_rsa_context *ctx_local;
  
  if (N == (mbedtls_mpi *)0x0) {
LAB_0011f5bd:
    if (P != (mbedtls_mpi *)0x0) {
      local_44 = mbedtls_mpi_copy(&ctx->P,P);
      if (local_44 != 0) goto LAB_0011f63d;
    }
    if (Q != (mbedtls_mpi *)0x0) {
      local_44 = mbedtls_mpi_copy(&ctx->Q,Q);
      if (local_44 != 0) goto LAB_0011f63d;
    }
    if (D != (mbedtls_mpi *)0x0) {
      local_44 = mbedtls_mpi_copy(&ctx->D,D);
      if (local_44 != 0) goto LAB_0011f63d;
    }
    if (E != (mbedtls_mpi *)0x0) {
      local_44 = mbedtls_mpi_copy(&ctx->E,E);
      if (local_44 != 0) goto LAB_0011f63d;
    }
    if (N != (mbedtls_mpi *)0x0) {
      sVar1 = mbedtls_mpi_size(&ctx->N);
      ctx->len = sVar1;
    }
    ctx_local._4_4_ = 0;
  }
  else {
    local_44 = mbedtls_mpi_copy(&ctx->N,N);
    if (local_44 == 0) goto LAB_0011f5bd;
LAB_0011f63d:
    ctx_local._4_4_ = local_44 + -0x4080;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_import( mbedtls_rsa_context *ctx,
                        const mbedtls_mpi *N,
                        const mbedtls_mpi *P, const mbedtls_mpi *Q,
                        const mbedtls_mpi *D, const mbedtls_mpi *E )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    RSA_VALIDATE_RET( ctx != NULL );

    if( ( N != NULL && ( ret = mbedtls_mpi_copy( &ctx->N, N ) ) != 0 ) ||
        ( P != NULL && ( ret = mbedtls_mpi_copy( &ctx->P, P ) ) != 0 ) ||
        ( Q != NULL && ( ret = mbedtls_mpi_copy( &ctx->Q, Q ) ) != 0 ) ||
        ( D != NULL && ( ret = mbedtls_mpi_copy( &ctx->D, D ) ) != 0 ) ||
        ( E != NULL && ( ret = mbedtls_mpi_copy( &ctx->E, E ) ) != 0 ) )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA + ret );
    }

    if( N != NULL )
        ctx->len = mbedtls_mpi_size( &ctx->N );

    return( 0 );
}